

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.cpp
# Opt level: O3

uint64_t __thiscall
flatbuffers::BinaryAnnotator::BuildHeader(BinaryAnnotator *this,uint64_t header_offset)

{
  undefined1 *puVar1;
  uint uVar2;
  uint8_t *puVar3;
  ulong uVar4;
  int iVar5;
  Object *pOVar6;
  ulong uVar7;
  long lVar8;
  uint64_t offset;
  ulong uVar9;
  uint64_t points_to_offset;
  bool bVar10;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> regions;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_428;
  BinaryAnnotator *local_410;
  BinaryRegionStatus local_408;
  undefined1 *local_400;
  long local_3f8;
  undefined1 local_3f0;
  undefined7 uStack_3ef;
  BinaryRegionCommentType local_3e0;
  undefined1 *local_3d8;
  long local_3d0;
  undefined1 local_3c8;
  undefined7 uStack_3c7;
  undefined1 *local_3b8;
  long local_3b0;
  undefined1 local_3a8;
  undefined7 uStack_3a7;
  size_t local_398;
  undefined1 local_390 [40];
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_368;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350;
  _Alloc_hider local_338;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  _Alloc_hider local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  long *local_2f0 [2];
  long local_2e0 [2];
  ulong local_2d0;
  uint64_t local_2c8;
  long *local_2c0 [2];
  long local_2b0 [2];
  string local_2a0;
  BinaryRegionCommentType local_278;
  undefined1 *local_270;
  long local_268;
  undefined1 local_260;
  undefined7 uStack_25f;
  undefined1 *local_250;
  long local_248;
  undefined1 local_240;
  undefined7 uStack_23f;
  size_t local_230;
  undefined1 local_228 [8];
  _Alloc_hider local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  BinaryRegionCommentType local_200;
  _Alloc_hider local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  _Alloc_hider local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  size_t local_1b8;
  undefined1 local_1b0 [8];
  _Alloc_hider local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  BinaryRegionCommentType local_188;
  _Alloc_hider local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  _Alloc_hider local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  size_t local_140;
  undefined1 local_138 [8];
  _Alloc_hider local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  BinaryRegionCommentType local_110;
  _Alloc_hider local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  _Alloc_hider local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  size_t local_c8;
  undefined1 local_c0 [8];
  _Alloc_hider local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  BinaryRegionCommentType local_98;
  _Alloc_hider local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  size_t local_50;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_48;
  
  local_428.
  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_428.
  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_428.
  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  offset = header_offset;
  local_410 = this;
  if (this->is_size_prefixed_ == true) {
    local_408 = OK;
    local_3f8 = 0;
    local_3f0 = 0;
    local_3d8 = &local_3c8;
    local_3d0 = 0;
    local_3c8 = 0;
    local_3b0 = 0;
    local_3a8 = 0;
    local_398 = 0;
    local_3e0 = SizePrefix;
    uVar7 = this->binary_length_;
    local_400 = &local_3f0;
    local_3b8 = &local_3a8;
    if ((header_offset + 7 < uVar7 && 8 < uVar7) &&
       (uVar7 < *(ulong *)(this->binary_ + header_offset))) {
      if ((header_offset + 3 < uVar7) &&
         (uVar7 < (*(ulong *)(this->binary_ + header_offset) & 0xffffffff))) {
        local_2f0[0] = local_2e0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"");
        local_408 = ERROR;
        std::__cxx11::string::_M_assign((string *)&local_400);
        if (local_2f0[0] != local_2e0) {
          operator_delete(local_2f0[0],local_2e0[0] + 1);
        }
      }
      else {
        local_1b0._0_4_ = OK;
        local_1a8._M_p = (pointer)&local_198;
        std::__cxx11::string::_M_construct<char*>((string *)&local_1a8,&local_3f0,&local_3f0);
        local_188 = local_3e0;
        local_180._M_p = (pointer)&local_170;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_180,local_3d8,local_3d8 + local_3d0);
        local_160._M_p = (pointer)&local_150;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_160,local_3b8,local_3b8 + local_3b0);
        local_140 = local_398;
        anon_unknown_49::MakeBinaryRegion
                  ((BinaryRegion *)local_390,header_offset,4,Uint32,0,0,
                   (BinaryRegionComment *)local_1b0);
        std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
        emplace_back<flatbuffers::BinaryRegion>(&local_428,(BinaryRegion *)local_390);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_p != &local_308) {
          operator_delete(local_318._M_p,local_308._M_allocated_capacity + 1);
        }
        this = local_410;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._M_p != &local_328) {
          operator_delete(local_338._M_p,local_328._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_368.
               super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
               ._M_impl.super__Vector_impl_data._M_finish != &local_350) {
          operator_delete(local_368.
                          super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                          local_350._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_p != &local_150) {
          operator_delete(local_160._M_p,local_150._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_p != &local_170) {
          operator_delete(local_180._M_p,local_170._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_p != &local_198) {
          operator_delete(local_1a8._M_p,local_198._M_allocated_capacity + 1);
        }
        offset = header_offset + 4;
      }
    }
    else {
      local_c0._0_4_ = OK;
      local_b8._M_p = (pointer)&local_a8;
      std::__cxx11::string::_M_construct<char*>((string *)&local_b8,&local_3f0,&local_3f0);
      local_98 = local_3e0;
      local_90._M_p = (pointer)&local_80;
      std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_3d8,local_3d8 + local_3d0)
      ;
      local_70._M_p = (pointer)&local_60;
      std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_3b8,local_3b8 + local_3b0)
      ;
      local_50 = local_398;
      anon_unknown_49::MakeBinaryRegion
                ((BinaryRegion *)local_390,header_offset,8,Uint64,0,0,
                 (BinaryRegionComment *)local_c0);
      std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
      emplace_back<flatbuffers::BinaryRegion>(&local_428,(BinaryRegion *)local_390);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_p != &local_308) {
        operator_delete(local_318._M_p,local_308._M_allocated_capacity + 1);
      }
      this = local_410;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_p != &local_328) {
        operator_delete(local_338._M_p,local_328._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368.
             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
             ._M_impl.super__Vector_impl_data._M_finish != &local_350) {
        operator_delete(local_368.
                        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
                        local_350._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_p != &local_60) {
        operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_p != &local_80) {
        operator_delete(local_90._M_p,local_80._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_p != &local_a8) {
        operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
      }
      offset = header_offset + 8;
    }
    if (local_3b8 != &local_3a8) {
      operator_delete(local_3b8,CONCAT71(uStack_3a7,local_3a8) + 1);
    }
    if (local_3d8 != &local_3c8) {
      operator_delete(local_3d8,CONCAT71(uStack_3c7,local_3c8) + 1);
    }
    if (local_400 != &local_3f0) {
      operator_delete(local_400,CONCAT71(uStack_3ef,local_3f0) + 1);
    }
  }
  points_to_offset = 0xffffffffffffffff;
  if (this->binary_length_ <= offset + 3 || this->binary_length_ < 5) goto LAB_0030343f;
  uVar2 = *(uint *)(this->binary_ + offset);
  local_400 = &local_3f0;
  local_408 = OK;
  local_3f8 = 0;
  local_3f0 = 0;
  local_3d8 = &local_3c8;
  local_3d0 = 0;
  local_3c8 = 0;
  local_3b8 = &local_3a8;
  local_3b0 = 0;
  local_3a8 = 0;
  local_398 = 0;
  local_3e0 = RootTableOffset;
  pOVar6 = RootTable(this);
  uVar7 = (ulong)*(ushort *)(pOVar6 + (4 - (long)*(int *)pOVar6));
  local_390._0_8_ = local_390 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_390,pOVar6 + *(uint *)(pOVar6 + uVar7) + uVar7 + 4,
             pOVar6 + (ulong)*(uint *)(pOVar6 + *(uint *)(pOVar6 + uVar7) + uVar7) +
                      *(uint *)(pOVar6 + uVar7) + uVar7 + 4);
  points_to_offset = uVar2 + offset;
  std::__cxx11::string::operator=((string *)&local_3d8,(string *)local_390);
  if ((undefined1 *)local_390._0_8_ != local_390 + 0x10) {
    operator_delete((void *)local_390._0_8_,local_390._16_8_ + 1);
  }
  if (this->binary_length_ <= points_to_offset) {
    local_2c0[0] = local_2b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,"");
    local_408 = ERROR_OFFSET_OUT_OF_BINARY;
    std::__cxx11::string::_M_assign((string *)&local_400);
    if (local_2c0[0] != local_2b0) {
      operator_delete(local_2c0[0],local_2b0[0] + 1);
    }
  }
  local_138._0_4_ = local_408;
  local_130._M_p = (pointer)&local_120;
  std::__cxx11::string::_M_construct<char*>((string *)&local_130,local_400,local_400 + local_3f8);
  local_110 = local_3e0;
  local_108._M_p = (pointer)&local_f8;
  local_2c8 = header_offset;
  std::__cxx11::string::_M_construct<char*>((string *)&local_108,local_3d8,local_3d8 + local_3d0);
  local_e8._M_p = (pointer)&local_d8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_e8,local_3b8,local_3b8 + local_3b0);
  local_c8 = local_398;
  anon_unknown_49::MakeBinaryRegion
            ((BinaryRegion *)local_390,offset,4,UOffset,0,points_to_offset,
             (BinaryRegionComment *)local_138);
  std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
  emplace_back<flatbuffers::BinaryRegion>(&local_428,(BinaryRegion *)local_390);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_p != &local_308) {
    operator_delete(local_318._M_p,local_308._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_p != &local_328) {
    operator_delete(local_338._M_p,local_328._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368.
         super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
         _M_impl.super__Vector_impl_data._M_finish != &local_350) {
    operator_delete(local_368.
                    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                    ._M_impl.super__Vector_impl_data._M_finish,local_350._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_p != &local_d8) {
    operator_delete(local_e8._M_p,local_d8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_p != &local_f8) {
    operator_delete(local_108._M_p,local_f8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_p != &local_120) {
    operator_delete(local_130._M_p,local_120._M_allocated_capacity + 1);
  }
  if (offset + 7 < this->binary_length_ && 4 < this->binary_length_) {
    uVar7 = offset + 4;
    if (uVar7 < 0xfffffffffffffffc) {
      puVar3 = this->binary_;
      iVar5 = isprint((uint)puVar3[uVar7]);
      if (iVar5 != 0) {
        local_2d0 = offset + 8;
        lVar8 = 3;
        uVar4 = offset + 5;
        do {
          uVar9 = uVar4;
          bVar10 = lVar8 == 0;
          lVar8 = lVar8 + -1;
          if (bVar10) break;
          iVar5 = isprint((uint)puVar3[uVar9]);
          uVar4 = uVar9 + 1;
        } while (iVar5 != 0);
        if (local_2d0 <= uVar9) goto LAB_003030b2;
      }
    }
    else {
LAB_003030b2:
      puVar1 = (undefined1 *)((long)&local_2a0.field_2 + 8);
      local_2a0._M_dataplus._M_p = (pointer)((ulong)local_2a0._M_dataplus._M_p._4_4_ << 0x20);
      local_2a0.field_2._M_allocated_capacity = 0;
      local_2a0.field_2._M_local_buf[8] = '\0';
      local_270 = &local_260;
      local_268 = 0;
      local_260 = 0;
      local_248 = 0;
      local_240 = 0;
      local_230 = 0;
      local_278 = FileIdentifier;
      local_228._0_4_ = OK;
      local_220._M_p = (pointer)&local_210;
      local_2a0._M_string_length = (size_type)puVar1;
      local_250 = &local_240;
      std::__cxx11::string::_M_construct<char*>((string *)&local_220,puVar1,puVar1);
      local_200 = local_278;
      local_1f8._M_p = (pointer)&local_1e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f8,local_270,local_270 + local_268);
      local_1d8._M_p = (pointer)&local_1c8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d8,local_250,local_250 + local_248);
      local_1b8 = local_230;
      anon_unknown_49::MakeBinaryRegion
                ((BinaryRegion *)local_390,uVar7,4,Char,4,0,(BinaryRegionComment *)local_228);
      std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
      emplace_back<flatbuffers::BinaryRegion>(&local_428,(BinaryRegion *)local_390);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_p != &local_308) {
        operator_delete(local_318._M_p,local_308._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_p != &local_328) {
        operator_delete(local_338._M_p,local_328._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368.
             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
             ._M_impl.super__Vector_impl_data._M_finish != &local_350) {
        operator_delete(local_368.
                        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
                        local_350._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_p != &local_1c8) {
        operator_delete(local_1d8._M_p,local_1c8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_p != &local_1e8) {
        operator_delete(local_1f8._M_p,local_1e8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_p != &local_210) {
        operator_delete(local_220._M_p,local_210._M_allocated_capacity + 1);
      }
      if (local_250 != &local_240) {
        operator_delete(local_250,CONCAT71(uStack_23f,local_240) + 1);
      }
      if (local_270 != &local_260) {
        operator_delete(local_270,CONCAT71(uStack_25f,local_260) + 1);
      }
      if ((undefined1 *)local_2a0._M_string_length != puVar1) {
        operator_delete((void *)local_2a0._M_string_length,
                        CONCAT71(local_2a0.field_2._9_7_,local_2a0.field_2._M_local_buf[8]) + 1);
      }
    }
  }
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"");
  local_48.super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_428.
       super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_48.super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_428.
       super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_428.
       super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_428.
  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_428.
  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_428.
  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  anon_unknown_49::MakeBinarySection((BinarySection *)local_390,&local_2a0,Header,&local_48);
  AddSection(local_410,local_2c8,(BinarySection *)local_390);
  std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
            (&local_368);
  if ((undefined1 *)local_390._0_8_ != local_390 + 0x10) {
    operator_delete((void *)local_390._0_8_,local_390._16_8_ + 1);
  }
  std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
            (&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  if (local_3b8 != &local_3a8) {
    operator_delete(local_3b8,CONCAT71(uStack_3a7,local_3a8) + 1);
  }
  if (local_3d8 != &local_3c8) {
    operator_delete(local_3d8,CONCAT71(uStack_3c7,local_3c8) + 1);
  }
  if (local_400 != &local_3f0) {
    operator_delete(local_400,CONCAT71(uStack_3ef,local_3f0) + 1);
  }
LAB_0030343f:
  std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
            (&local_428);
  return points_to_offset;
}

Assistant:

uint64_t BinaryAnnotator::BuildHeader(const uint64_t header_offset) {
  uint64_t offset = header_offset;
  std::vector<BinaryRegion> regions;

  // If this binary is a size prefixed one, attempt to parse the size.
  if (is_size_prefixed_) {
    BinaryRegionComment prefix_length_comment;
    prefix_length_comment.type = BinaryRegionCommentType::SizePrefix;

    bool has_prefix_value = false;
    const auto prefix_length = ReadScalar<uoffset64_t>(offset);
    if (*prefix_length <= binary_length_) {
      regions.push_back(MakeBinaryRegion(offset, sizeof(uoffset64_t),
                                         BinaryRegionType::Uint64, 0, 0,
                                         prefix_length_comment));
      offset += sizeof(uoffset64_t);
      has_prefix_value = true;
    }

    if (!has_prefix_value) {
      const auto prefix_length = ReadScalar<uoffset_t>(offset);
      if (*prefix_length <= binary_length_) {
        regions.push_back(MakeBinaryRegion(offset, sizeof(uoffset_t),
                                           BinaryRegionType::Uint32, 0, 0,
                                           prefix_length_comment));
        offset += sizeof(uoffset_t);
        has_prefix_value = true;
      }
    }

    if (!has_prefix_value) {
      SetError(prefix_length_comment, BinaryRegionStatus::ERROR);
    }
  }

  const auto root_table_offset = ReadScalar<uint32_t>(offset);

  if (!root_table_offset.has_value()) {
    // This shouldn't occur, since we validate the min size of the buffer
    // before. But for completion sake, we shouldn't read passed the binary end.
    return std::numeric_limits<uint64_t>::max();
  }

  const auto root_table_loc = offset + *root_table_offset;

  BinaryRegionComment root_offset_comment;
  root_offset_comment.type = BinaryRegionCommentType::RootTableOffset;
  root_offset_comment.name = RootTable()->name()->str();

  if (!IsValidOffset(root_table_loc)) {
    SetError(root_offset_comment,
             BinaryRegionStatus::ERROR_OFFSET_OUT_OF_BINARY);
  }

  regions.push_back(MakeBinaryRegion(offset, sizeof(uint32_t),
                                     BinaryRegionType::UOffset, 0,
                                     root_table_loc, root_offset_comment));
  offset += sizeof(uint32_t);

  if (IsValidRead(offset, flatbuffers::kFileIdentifierLength) &&
      IsPrintableRegion(offset, flatbuffers::kFileIdentifierLength, binary_)) {
    BinaryRegionComment comment;
    comment.type = BinaryRegionCommentType::FileIdentifier;
    // Check if the file identifier region has non-zero data, and assume its
    // the file identifier. Otherwise, it will get filled in with padding
    // later.
    regions.push_back(MakeBinaryRegion(
        offset, flatbuffers::kFileIdentifierLength * sizeof(uint8_t),
        BinaryRegionType::Char, flatbuffers::kFileIdentifierLength, 0,
        comment));
  }

  AddSection(header_offset, MakeBinarySection("", BinarySectionType::Header,
                                              std::move(regions)));

  return root_table_loc;
}